

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O1

double __thiscall FNodeBuilder::AddIntersection(FNodeBuilder *this,node_t *node,int vertex)

{
  FPrivVert *pFVar1;
  FEvent *pFVar2;
  FEventTree *this_00;
  double key;
  
  pFVar1 = (this->Vertices).Array;
  key = (double)node->dy * ((double)pFVar1[vertex].super_FSimpleVert.y - (double)node->y) +
        (double)node->dx * ((double)pFVar1[vertex].super_FSimpleVert.x - (double)node->x);
  this_00 = &this->Events;
  pFVar2 = FEventTree::FindEvent(this_00,key);
  if (pFVar2 == (FEvent *)0x0) {
    pFVar2 = FEventTree::GetNewNode(this_00);
    pFVar2->Distance = key;
    (pFVar2->Info).Vertex = -1;
    (pFVar2->Info).FrontSeg = 0xffffffff;
    (pFVar2->Info).Vertex = vertex;
    FEventTree::Insert(this_00,pFVar2);
  }
  return key;
}

Assistant:

double FNodeBuilder::AddIntersection (const node_t &node, int vertex)
{
	static const FEventInfo defaultInfo =
	{
		-1, DWORD_MAX
	};

	// Calculate signed distance of intersection vertex from start of splitter.
	// Only ordering is important, so we don't need a sqrt.
	FPrivVert *v = &Vertices[vertex];
	double dist = (double(v->x) - node.x)*(node.dx) + (double(v->y) - node.y)*(node.dy);

	FEvent *event = Events.FindEvent (dist);
	if (event == NULL)
	{
		event = Events.GetNewNode ();
		event->Distance = dist;
		event->Info = defaultInfo;
		event->Info.Vertex = vertex;
		Events.Insert (event);
	}
	return dist;
}